

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decompiler.cpp
# Opt level: O0

int __thiscall r_comp::Decompiler::init(Decompiler *this,EVP_PKEY_CTX *ctx)

{
  bool bVar1;
  size_t sVar2;
  Class *pCVar3;
  long lVar4;
  offset_in_Decompiler_to_subr *poVar5;
  size_t p;
  string class_name;
  Class *c;
  uint16_t i;
  Metadata *metadata_local;
  Decompiler *this_local;
  
  this->metadata = (Metadata *)ctx;
  this->time_offset = 0;
  this->partial_decompilation = false;
  this->ignore_named_objects = false;
  for (c._6_2_ = 0;
      sVar2 = r_code::vector<r_comp::Class>::size((vector<r_comp::Class> *)(ctx + 0xf0)),
      c._6_2_ < sVar2; c._6_2_ = c._6_2_ + 1) {
    pCVar3 = Metadata::get_class((Metadata *)ctx,(ulong)c._6_2_);
    std::__cxx11::string::string((string *)&p,(string *)&pCVar3->str_opcode);
    lVar4 = std::__cxx11::string::find((char *)&p,0x1ca8d9);
    if (lVar4 == -1) {
      bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p,"grp");
      if (bVar1) {
        poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                           (&this->renderers,(ulong)c._6_2_);
        *poVar5 = (offset_in_Decompiler_to_subr)write_group;
        poVar5[1] = 0;
      }
      else {
        bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *
                                )&p,"ipgm");
        if ((bVar1) ||
           (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&p,"icpp_pgm"), bVar1)) {
          poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                             (&this->renderers,(ulong)c._6_2_);
          *poVar5 = (offset_in_Decompiler_to_subr)write_ipgm;
          poVar5[1] = 0;
        }
        else {
          bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                   *)&p,"pgm");
          if ((bVar1) ||
             (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p,"|pgm"), bVar1)) {
            poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                               (&this->renderers,(ulong)c._6_2_);
            *poVar5 = (offset_in_Decompiler_to_subr)write_pgm;
            poVar5[1] = 0;
          }
          else {
            bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                     *)&p,"icmd");
            if (bVar1) {
              poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                 (&this->renderers,(ulong)c._6_2_);
              *poVar5 = (offset_in_Decompiler_to_subr)write_icmd;
              poVar5[1] = 0;
            }
            else {
              bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                       *)&p,"cmd");
              if (bVar1) {
                poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                   (&this->renderers,(ulong)c._6_2_);
                *poVar5 = (offset_in_Decompiler_to_subr)write_cmd;
                poVar5[1] = 0;
              }
              else {
                bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                         *)&p,"fact");
                if ((bVar1) ||
                   (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&p,"|fact"), bVar1)) {
                  poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                                     (&this->renderers,(ulong)c._6_2_);
                  *poVar5 = (offset_in_Decompiler_to_subr)write_fact;
                  poVar5[1] = 0;
                }
                else {
                  bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                           *)&p,"cst");
                  if ((bVar1) ||
                     (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                               *)&p,"mdl"), bVar1)) {
                    poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                             operator[](&this->renderers,(ulong)c._6_2_);
                    *poVar5 = (offset_in_Decompiler_to_subr)write_hlp;
                    poVar5[1] = 0;
                  }
                  else {
                    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                             *)&p,"icst");
                    if ((bVar1) ||
                       (bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                 *)&p,"imdl"), bVar1)) {
                      poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                               operator[](&this->renderers,(ulong)c._6_2_);
                      *poVar5 = (offset_in_Decompiler_to_subr)write_ihlp;
                      poVar5[1] = 0;
                    }
                    else {
                      poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::
                               operator[](&this->renderers,(ulong)c._6_2_);
                      *poVar5 = (offset_in_Decompiler_to_subr)write_expression;
                      poVar5[1] = 0;
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
    else {
      poVar5 = r_code::vector<void_(r_comp::Decompiler::*)(unsigned_short)>::operator[]
                         (&this->renderers,(ulong)c._6_2_);
      *poVar5 = (offset_in_Decompiler_to_subr)write_marker;
      poVar5[1] = 0;
    }
    std::__cxx11::string::~string((string *)&p);
  }
  return (int)c._6_2_;
}

Assistant:

void Decompiler::init(r_comp::Metadata *metadata)
{
    this->metadata = metadata;
    this->time_offset = 0;
    partial_decompilation = false;
    ignore_named_objects = false;

    // Load the renderers;
    for (uint16_t i = 0; i < metadata->classes_by_opcodes.size(); ++i) {
        Class *c = metadata->get_class(i);
        std::string class_name = c->str_opcode;
        size_t p = class_name.find("mk.");

        if (p != std::string::npos) {
            renderers[i] = &Decompiler::write_marker;
        } else if (class_name == "grp") {
            renderers[i] = &Decompiler::write_group;
        } else if (class_name == "ipgm" || class_name == "icpp_pgm") {
            renderers[i] = &Decompiler::write_ipgm;
        } else if (class_name == "pgm" || class_name == "|pgm") {
            renderers[i] = &Decompiler::write_pgm;
        } else if (class_name == "icmd") {
            renderers[i] = &Decompiler::write_icmd;
        } else if (class_name == "cmd") {
            renderers[i] = &Decompiler::write_cmd;
        } else if (class_name == "fact" || class_name == "|fact") {
            renderers[i] = &Decompiler::write_fact;
        } else if (class_name == "cst" || class_name == "mdl") {
            renderers[i] = &Decompiler::write_hlp;
        } else if (class_name == "icst" || class_name == "imdl") {
            renderers[i] = &Decompiler::write_ihlp;
        } else {
            renderers[i] = &Decompiler::write_expression;
        }
    }
}